

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O0

QLoggingCategory * lcGestureManager(void)

{
  int iVar1;
  
  if (lcGestureManager()::category == '\0') {
    iVar1 = __cxa_guard_acquire(&lcGestureManager()::category);
    if (iVar1 != 0) {
      QLoggingCategory::QLoggingCategory
                (&lcGestureManager::category,"qt.widgets.gestures",QtDebugMsg);
      __cxa_atexit(QLoggingCategory::~QLoggingCategory,&lcGestureManager::category,&__dso_handle);
      __cxa_guard_release(&lcGestureManager()::category);
    }
  }
  return &lcGestureManager::category;
}

Assistant:

static inline int panTouchPoints()
{
    // Override by environment variable for testing.
    static const char panTouchPointVariable[] = "QT_PAN_TOUCHPOINTS";
    if (qEnvironmentVariableIsSet(panTouchPointVariable)) {
        bool ok;
        const int result = qEnvironmentVariableIntValue(panTouchPointVariable, &ok);
        if (ok && result >= 1)
            return result;
        qWarning("Ignoring invalid value of %s", panTouchPointVariable);
    }
    // Pan should use 1 finger on a touch screen and 2 fingers on touch pads etc.
    // where 1 finger movements are used for mouse event synthetization. For now,
    // default to 2 until all classes inheriting QScrollArea are fixed to handle it
    // correctly.
    return 2;
}